

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IsRowid(char *z)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  char *pcVar7;
  uchar uVar8;
  ulong uVar9;
  uchar uVar10;
  byte *pbVar11;
  
  bVar6 = *z;
  pcVar5 = "OID";
  if (bVar6 != 0) {
    uVar4 = (ulong)(uint)bVar6;
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      uVar8 = ""[uVar4];
      uVar10 = ""[(byte)"_ROWID_"[lVar3]];
      if (uVar8 != uVar10) goto LAB_001866d8;
      uVar4 = (ulong)(byte)z[lVar3 + 1];
      lVar2 = lVar3 + 1;
    } while (z[lVar3 + 1] != 0);
    uVar10 = ""[(byte)"_ROWID_"[lVar3 + 1]];
    uVar8 = '\0';
LAB_001866d8:
    if (uVar8 == uVar10) {
      return 1;
    }
    pbVar11 = (byte *)(z + 1);
    pcVar7 = "ROWID";
    uVar4 = (ulong)(uint)bVar6;
    do {
      uVar9 = uVar4;
      if (""[uVar4] != ""[(byte)*pcVar7]) break;
      pcVar7 = (char *)((byte *)pcVar7 + 1);
      bVar1 = *pbVar11;
      uVar4 = (ulong)bVar1;
      pbVar11 = pbVar11 + 1;
      uVar9 = 0;
    } while (bVar1 != 0);
    if (""[uVar9] == ""[(byte)*pcVar7]) {
      return 1;
    }
    if (bVar6 != 0) {
      pbVar11 = (byte *)(z + 1);
      pcVar5 = "OID";
      do {
        uVar4 = (ulong)bVar6;
        if (""[bVar6] != ""[(byte)*pcVar5]) break;
        pcVar5 = (char *)((byte *)pcVar5 + 1);
        bVar6 = *pbVar11;
        pbVar11 = pbVar11 + 1;
        uVar4 = 0;
      } while (bVar6 != 0);
      goto LAB_0018675f;
    }
  }
  uVar4 = 0;
LAB_0018675f:
  return (uint)(""[uVar4] == ""[(byte)*pcVar5]);
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  register unsigned char *a, *b;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return UpperToLower[*a] - UpperToLower[*b];
}